

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

int zip_resolve_symlink(PHYSFS_Io *io,ZIPinfo *info,ZIPentry *entry)

{
  PHYSFS_uint16 entryversion;
  size_t _len;
  PHYSFS_uint8 *pPVar1;
  undefined1 *puVar2;
  int iVar3;
  char *path_00;
  undefined1 *puVar4;
  void *pvVar5;
  ZIPentry *pZVar6;
  undefined1 auStack_d8 [7];
  bool local_d1;
  undefined1 *local_d0;
  undefined1 *local_c8;
  void *local_c0;
  PHYSFS_uint8 *compressed;
  size_t complen;
  mz_stream stream;
  int rc;
  char *path;
  size_t size;
  ZIPentry *entry_local;
  ZIPinfo *info_local;
  PHYSFS_Io *io_local;
  
  puVar4 = auStack_d8;
  _len = entry->uncompressed_size;
  stream.reserved._4_4_ = 0;
  iVar3 = (*io->seek)(io,entry->offset);
  if (iVar3 == 0) {
    io_local._4_4_ = 0;
  }
  else {
    if (_len + 1 < 0x100) {
      puVar4 = auStack_d8 + -(_len + 0x18 & 0xfffffffffffffff0);
      local_c8 = puVar4;
    }
    else {
      local_c8 = (undefined1 *)0x0;
    }
    puVar2 = local_c8;
    *(undefined8 *)(puVar4 + -8) = 0x123898;
    path_00 = (char *)__PHYSFS_initSmallAlloc(puVar2,_len + 1);
    if (path_00 == (char *)0x0) {
      *(undefined8 *)(puVar4 + -8) = 0x1238ad;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      io_local._4_4_ = 0;
    }
    else {
      if (entry->compression_method == 0) {
        *(undefined8 *)(puVar4 + -8) = 0x1238d9;
        stream.reserved._4_4_ = __PHYSFS_readAll(io,path_00,_len);
      }
      else {
        pPVar1 = (PHYSFS_uint8 *)entry->compressed_size;
        if (pPVar1 < (PHYSFS_uint8 *)0x100) {
          puVar4 = puVar4 + -((ulong)(pPVar1 + 0x17) & 0xfffffffffffffff0);
          local_d0 = puVar4;
        }
        else {
          local_d0 = (undefined1 *)0x0;
        }
        puVar2 = local_d0;
        compressed = pPVar1;
        *(undefined8 *)(puVar4 + -8) = 0x12393c;
        pvVar5 = __PHYSFS_initSmallAlloc(puVar2,(size_t)pPVar1);
        pPVar1 = compressed;
        local_c0 = pvVar5;
        if (pvVar5 != (void *)0x0) {
          *(undefined8 *)(puVar4 + -8) = 0x123968;
          iVar3 = __PHYSFS_readAll(io,pvVar5,(size_t)pPVar1);
          if (iVar3 != 0) {
            *(undefined8 *)(puVar4 + -8) = 0x12397d;
            initializeZStream((mz_stream *)&complen);
            complen = (size_t)local_c0;
            stream.next_in._0_4_ = SUB84(compressed,0);
            stream.next_out._0_4_ = (undefined4)_len;
            stream.total_in = (mz_ulong)path_00;
            *(undefined8 *)(puVar4 + -8) = 0x1239be;
            iVar3 = mz_inflateInit2((mz_streamp)&complen,-0xf);
            *(undefined8 *)(puVar4 + -8) = 0x1239c5;
            iVar3 = zlib_err(iVar3);
            if (iVar3 == 0) {
              *(undefined8 *)(puVar4 + -8) = 0x1239db;
              iVar3 = mz_inflate((mz_streamp)&complen,4);
              *(undefined8 *)(puVar4 + -8) = 0x1239e2;
              stream.reserved._4_4_ = zlib_err(iVar3);
              *(undefined8 *)(puVar4 + -8) = 0x1239f1;
              mz_inflateEnd((mz_streamp)&complen);
              local_d1 = stream.reserved._4_4_ < 2;
              stream.reserved._4_4_ = (uint)local_d1;
            }
          }
          pvVar5 = local_c0;
          *(undefined8 *)(puVar4 + -8) = 0x123a28;
          __PHYSFS_smallFree(pvVar5);
        }
      }
      if (stream.reserved._4_4_ != 0) {
        path_00[entry->uncompressed_size] = '\0';
        entryversion = entry->version;
        *(undefined8 *)(puVar4 + -8) = 0x123a54;
        zip_convert_dos_path(entryversion,path_00);
        *(undefined8 *)(puVar4 + -8) = 0x123a65;
        pZVar6 = zip_follow_symlink(io,info,path_00);
        entry->symlink = pZVar6;
      }
      *(undefined8 *)(puVar4 + -8) = 0x123a79;
      __PHYSFS_smallFree(path_00);
      io_local._4_4_ = (uint)(entry->symlink != (_ZIPentry *)0x0);
    }
  }
  return io_local._4_4_;
}

Assistant:

static int zip_resolve_symlink(PHYSFS_Io *io, ZIPinfo *info, ZIPentry *entry)
{
    const size_t size = (size_t) entry->uncompressed_size;
    char *path = NULL;
    int rc = 0;

    /*
     * We've already parsed the local file header of the symlink at this
     *  point. Now we need to read the actual link from the file data and
     *  follow it.
     */

    BAIL_IF_ERRPASS(!io->seek(io, entry->offset), 0);

    path = (char *) __PHYSFS_smallAlloc(size + 1);
    BAIL_IF(!path, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    
    if (entry->compression_method == COMPMETH_NONE)
        rc = __PHYSFS_readAll(io, path, size);

    else  /* symlink target path is compressed... */
    {
        z_stream stream;
        const size_t complen = (size_t) entry->compressed_size;
        PHYSFS_uint8 *compressed = (PHYSFS_uint8*) __PHYSFS_smallAlloc(complen);
        if (compressed != NULL)
        {
            if (__PHYSFS_readAll(io, compressed, complen))
            {
                initializeZStream(&stream);
                stream.next_in = compressed;
                stream.avail_in = (unsigned int) complen;
                stream.next_out = (unsigned char *) path;
                stream.avail_out = (unsigned int) size;
                if (zlib_err(inflateInit2(&stream, -MAX_WBITS)) == Z_OK)
                {
                    rc = zlib_err(inflate(&stream, Z_FINISH));
                    inflateEnd(&stream);

                    /* both are acceptable outcomes... */
                    rc = ((rc == Z_OK) || (rc == Z_STREAM_END));
                } /* if */
            } /* if */
            __PHYSFS_smallFree(compressed);
        } /* if */
    } /* else */

    if (rc)
    {
        path[entry->uncompressed_size] = '\0';    /* null-terminate it. */
        zip_convert_dos_path(entry->version, path);
        entry->symlink = zip_follow_symlink(io, info, path);
    } /* else */

    __PHYSFS_smallFree(path);

    return (entry->symlink != NULL);
}